

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void __thiscall APlayerPawn::CheckWeaponSwitch(APlayerPawn *this,PClassAmmo *ammotype)

{
  bool bVar1;
  AWeapon *pAVar2;
  AWeapon *best;
  PClassAmmo *ammotype_local;
  APlayerPawn *this_local;
  
  bVar1 = userinfo_t::GetNeverSwitch(&((this->super_AActor).player)->userinfo);
  if (((((!bVar1) &&
        (((this->super_AActor).player)->PendingWeapon ==
         (AWeapon *)AWeapon::RegistrationInfo.MyClass)) &&
       ((((this->super_AActor).player)->ReadyWeapon == (AWeapon *)0x0 ||
        ((*(uint *)&(((this->super_AActor).player)->ReadyWeapon->super_AStateProvider).
                    super_AInventory.field_0x4fc & 0x200) != 0)))) &&
      (pAVar2 = BestWeapon(this,ammotype), pAVar2 != (AWeapon *)0x0)) &&
     ((((this->super_AActor).player)->ReadyWeapon == (AWeapon *)0x0 ||
      (pAVar2->SelectionOrder < ((this->super_AActor).player)->ReadyWeapon->SelectionOrder)))) {
    ((this->super_AActor).player)->PendingWeapon = pAVar2;
  }
  return;
}

Assistant:

void APlayerPawn::CheckWeaponSwitch(PClassAmmo *ammotype)
{
	if (!player->userinfo.GetNeverSwitch() &&
		player->PendingWeapon == WP_NOCHANGE && 
		(player->ReadyWeapon == NULL ||
		 (player->ReadyWeapon->WeaponFlags & WIF_WIMPY_WEAPON)))
	{
		AWeapon *best = BestWeapon (ammotype);
		if (best != NULL && (player->ReadyWeapon == NULL ||
			best->SelectionOrder < player->ReadyWeapon->SelectionOrder))
		{
			player->PendingWeapon = best;
		}
	}
}